

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveOutput(FastText *this)

{
  string *in_stack_00000298;
  FastText *in_stack_000002a0;
  string local_28 [8];
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16f177);
  std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  saveOutput(in_stack_000002a0,in_stack_00000298);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void FastText::saveOutput() {
  saveOutput(args_->output + ".output");
}